

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

size_t __thiscall czh::file::StreamFile::get_arrowpos(StreamFile *this,size_t pos)

{
  undefined8 uVar1;
  bool bVar2;
  pointer pbVar3;
  type pbVar4;
  istream *piVar5;
  size_type sVar6;
  fpos<__mbstate_t> local_68 [2];
  undefined1 local_48 [8];
  string tmp;
  size_t postmp;
  size_t pos_local;
  StreamFile *this_local;
  
  tmp.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)local_48);
  pbVar3 = std::
           unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
           ::operator->(&this->file);
  std::ios::clear(pbVar3 + *(long *)(*(long *)pbVar3 + -0x18),0);
  pbVar3 = std::
           unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
           ::operator->(&this->file);
  std::fpos<__mbstate_t>::fpos(local_68,0);
  std::istream::seekg(pbVar3,local_68[0]._M_off,local_68[0]._M_state);
  do {
    pbVar4 = std::
             unique_ptr<std::basic_ifstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
             ::operator*(&this->file);
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)pbVar4,(string *)local_48);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    uVar1 = tmp.field_2._8_8_;
    if (!bVar2) {
      this_local = (StreamFile *)0x0;
LAB_0012889a:
      std::__cxx11::string::~string((string *)local_48);
      return (size_t)this_local;
    }
    sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
    if (pos <= uVar1 + sVar6) {
      this_local = (StreamFile *)((pos - tmp.field_2._8_8_) + 1);
      goto LAB_0012889a;
    }
    sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48
                      );
    tmp.field_2._8_8_ = sVar6 + 1 + tmp.field_2._8_8_;
  } while( true );
}

Assistant:

[[nodiscard]] std::size_t get_arrowpos(std::size_t pos) const override
    {
      std::size_t postmp = 0;
      std::string tmp;
      file->clear();
      file->seekg(std::ios::beg);
      while (std::getline(*file, tmp))
      {
        if (postmp + tmp.size() >= pos) return pos - postmp + 1;
        postmp += tmp.size() + 1;
      }
      return 0;
    }